

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

int xmlListInsert(xmlListPtr l,void *data)

{
  _xmlLink *p_Var1;
  _xmlLink *p_Var2;
  xmlGenericErrorFunc p_Var3;
  xmlLinkPtr pxVar4;
  _xmlLink *p_Var5;
  xmlGenericErrorFunc *pp_Var6;
  void **ppvVar7;
  int iVar8;
  
  iVar8 = 1;
  if (l != (xmlListPtr)0x0) {
    pxVar4 = xmlListLowerSearch(l,data);
    p_Var5 = (_xmlLink *)(*xmlMalloc)(0x18);
    if (p_Var5 == (_xmlLink *)0x0) {
      pp_Var6 = __xmlGenericError();
      p_Var3 = *pp_Var6;
      ppvVar7 = __xmlGenericErrorContext();
      (*p_Var3)(*ppvVar7,"Cannot initialize memory for new link");
    }
    else {
      p_Var5->data = data;
      p_Var1 = pxVar4->prev;
      p_Var2 = p_Var1->next;
      p_Var5->next = p_Var2;
      p_Var2->prev = p_Var5;
      p_Var1->next = p_Var5;
      p_Var5->prev = p_Var1;
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

int
xmlListInsert(xmlListPtr l, void *data)
{
    xmlLinkPtr lkPlace, lkNew;

    if (l == NULL)
        return(1);
    lkPlace = xmlListLowerSearch(l, data);
    /* Add the new link */
    lkNew = (xmlLinkPtr) xmlMalloc(sizeof(xmlLink));
    if (lkNew == NULL) {
        xmlGenericError(xmlGenericErrorContext,
		        "Cannot initialize memory for new link");
        return (1);
    }
    lkNew->data = data;
    lkPlace = lkPlace->prev;
    lkNew->next = lkPlace->next;
    (lkPlace->next)->prev = lkNew;
    lkPlace->next = lkNew;
    lkNew->prev = lkPlace;
    return 0;
}